

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O3

transformation_t *
opengv::point_cloud::threept_arun
          (transformation_t *__return_storage_ptr__,PointCloudAdapterBase *adapter,Indices *indices)

{
  long *plVar1;
  undefined8 *puVar2;
  double dVar3;
  undefined8 uVar4;
  byte bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined8 uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  ulong uVar18;
  double *pdVar19;
  Index outer;
  int iVar20;
  size_t sVar21;
  ulong uVar22;
  ulong uVar23;
  int iVar24;
  long lVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  double dVar31;
  undefined1 auVar32 [16];
  undefined1 in_ZMM1 [64];
  MatrixXd Hcross;
  rotation_t rotation;
  Vector3d f;
  double local_110;
  DenseStorage<double,__1,__1,__1,_0> local_108;
  size_t local_f0;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  double local_a8 [2];
  undefined1 local_98 [32];
  long lStack_78;
  double local_70;
  undefined1 local_68 [16];
  double local_58;
  undefined1 local_48 [16];
  double local_38;
  
  auVar26 = in_ZMM1._0_16_;
  local_f0 = indices->_numberCorrespondences;
  if (local_f0 == 0) {
    local_a8[0] = 0.0;
    local_d8 = ZEXT816(0);
    local_110 = 0.0;
    local_e8 = ZEXT816(0);
  }
  else {
    local_a8[0] = 0.0;
    local_d8 = ZEXT816(0);
    lVar25 = 0;
    sVar21 = 0;
    local_e8 = ZEXT816(0);
    local_110 = 0.0;
    do {
      local_c8._0_8_ = local_a8[0];
      iVar20 = (int)sVar21;
      iVar24 = iVar20;
      if (indices->_useIndices != false) {
        iVar24 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                                _M_impl.super__Vector_impl_data._M_start + (lVar25 >> 0x1e));
      }
      (*adapter->_vptr_PointCloudAdapterBase[2])(local_98,adapter,(long)iVar24);
      if (indices->_useIndices != false) {
        iVar20 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                                _M_impl.super__Vector_impl_data._M_start + (lVar25 >> 0x1e));
      }
      local_e8._8_8_ = (double)local_e8._8_8_ + (double)local_98._8_8_;
      local_e8._0_8_ = (double)local_e8._0_8_ + (double)local_98._0_8_;
      local_110 = local_110 + (double)local_98._16_8_;
      (*adapter->_vptr_PointCloudAdapterBase[3])(local_98,adapter,(long)iVar20);
      auVar26 = in_ZMM1._0_16_;
      sVar21 = sVar21 + 1;
      local_d8._0_8_ = (double)local_d8._0_8_ + (double)local_98._0_8_;
      local_d8._8_8_ = (double)local_d8._8_8_ + (double)local_98._8_8_;
      local_a8[0] = (double)local_c8._0_8_ + (double)local_98._16_8_;
      lVar25 = lVar25 + 0x100000000;
    } while (local_f0 != sVar21);
  }
  local_c8 = vcvtusi2sd_avx512f(auVar26,local_f0);
  local_108.m_cols = 0;
  dVar31 = local_c8._0_8_;
  auVar26._8_8_ = dVar31;
  auVar26._0_8_ = dVar31;
  local_b8 = vdivpd_avx(local_d8,auVar26);
  local_a8[0] = local_a8[0] / dVar31;
  local_108.m_data = (double *)0x0;
  local_108.m_rows = 0;
  local_d8 = auVar26;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_108,9,3,3);
  if ((local_108.m_rows == 3) && (local_108.m_cols == 3)) {
    uVar23 = 9;
    uVar22 = 8;
  }
  else {
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_108,9,3,3);
    uVar23 = local_108.m_cols * local_108.m_rows;
    uVar22 = uVar23 + 7;
    if (-1 < (long)uVar23) {
      uVar22 = uVar23;
    }
    uVar22 = uVar22 & 0xfffffffffffffff8;
    pdVar19 = local_108.m_data;
    if ((long)uVar23 < 8) goto LAB_00115a8b;
  }
  pdVar19 = local_108.m_data;
  uVar18 = 8;
  if (8 < (long)uVar22) {
    uVar18 = uVar22;
  }
  memset(local_108.m_data,0,uVar18 * 8);
LAB_00115a8b:
  if (uVar23 - uVar22 != 0 && (long)uVar22 <= (long)uVar23) {
    memset(pdVar19 + uVar22,0,(uVar23 - uVar22) * 8);
  }
  local_e8 = vdivpd_avx(local_e8,local_d8);
  local_110 = local_110 / (double)local_c8._0_8_;
  if (local_f0 != 0) {
    sVar21 = 0;
    local_c8 = local_b8;
    local_d8._0_8_ = local_a8[0];
    do {
      iVar24 = (int)sVar21;
      iVar20 = iVar24;
      if (indices->_useIndices == true) {
        iVar20 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start[iVar24];
      }
      (*adapter->_vptr_PointCloudAdapterBase[2])(local_98,adapter,(long)iVar20);
      auVar15._8_8_ = local_98._8_8_;
      auVar15._0_8_ = local_98._0_8_;
      local_48 = vsubpd_avx(auVar15,local_e8);
      local_38 = (double)local_98._16_8_ - local_110;
      if (indices->_useIndices == true) {
        iVar24 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start[iVar24];
      }
      (*adapter->_vptr_PointCloudAdapterBase[3])(local_98,adapter,(long)iVar24);
      auVar16._8_8_ = local_98._8_8_;
      auVar16._0_8_ = local_98._0_8_;
      lVar25 = 0;
      auVar26 = vsubpd_avx(auVar16,local_c8);
      dVar31 = (double)local_98._16_8_ - (double)local_d8._0_8_;
      pdVar19 = (double *)(local_98 + 0x10);
      do {
        dVar3 = *(double *)(local_48 + lVar25 * 8);
        lVar25 = lVar25 + 1;
        pdVar19[-2] = auVar26._0_8_ * dVar3;
        pdVar19[-1] = auVar26._8_8_ * dVar3;
        *pdVar19 = dVar31 * dVar3;
        pdVar19 = pdVar19 + 3;
      } while (lVar25 != 3);
      uVar23 = local_108.m_cols * local_108.m_rows;
      uVar22 = uVar23 + 7;
      if (-1 < (long)uVar23) {
        uVar22 = uVar23;
      }
      if (7 < (long)uVar23) {
        lVar25 = 0;
        do {
          auVar27 = vaddpd_avx512f(*(undefined1 (*) [64])(local_98 + lVar25 * 8),
                                   *(undefined1 (*) [64])(local_108.m_data + lVar25));
          *(undefined1 (*) [64])(local_108.m_data + lVar25) = auVar27;
          lVar25 = lVar25 + 8;
        } while (lVar25 < (long)(uVar22 & 0xfffffffffffffff8));
      }
      auVar27 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      if ((long)uVar23 % 8 != 0 && (long)(uVar22 & 0xfffffffffffffff8) <= (long)uVar23) {
        lVar25 = (long)uVar22 >> 3;
        auVar28 = vpbroadcastq_avx512f();
        uVar22 = 0;
        do {
          auVar29 = vpbroadcastq_avx512f();
          auVar29 = vporq_avx512f(auVar29,auVar27);
          uVar18 = vpcmpuq_avx512f(auVar29,auVar28,2);
          plVar1 = (long *)(local_98 + uVar22 * 8 + lVar25 * 0x40);
          bVar5 = (byte)uVar18;
          auVar29._8_8_ = (ulong)((byte)(uVar18 >> 1) & 1) * plVar1[1];
          auVar29._0_8_ = (ulong)(bVar5 & 1) * *plVar1;
          auVar29._16_8_ = (ulong)((byte)(uVar18 >> 2) & 1) * plVar1[2];
          auVar29._24_8_ = (ulong)((byte)(uVar18 >> 3) & 1) * plVar1[3];
          auVar29._32_8_ = (ulong)((byte)(uVar18 >> 4) & 1) * plVar1[4];
          auVar29._40_8_ = (ulong)((byte)(uVar18 >> 5) & 1) * plVar1[5];
          auVar29._48_8_ = (ulong)((byte)(uVar18 >> 6) & 1) * plVar1[6];
          auVar29._56_8_ = (uVar18 >> 7) * plVar1[7];
          pdVar19 = local_108.m_data + lVar25 * 8 + uVar22;
          auVar30._8_8_ = (ulong)((byte)(uVar18 >> 1) & 1) * (long)pdVar19[1];
          auVar30._0_8_ = (ulong)(bVar5 & 1) * (long)*pdVar19;
          auVar30._16_8_ = (ulong)((byte)(uVar18 >> 2) & 1) * (long)pdVar19[2];
          auVar30._24_8_ = (ulong)((byte)(uVar18 >> 3) & 1) * (long)pdVar19[3];
          auVar30._32_8_ = (ulong)((byte)(uVar18 >> 4) & 1) * (long)pdVar19[4];
          auVar30._40_8_ = (ulong)((byte)(uVar18 >> 5) & 1) * (long)pdVar19[5];
          auVar30._48_8_ = (ulong)((byte)(uVar18 >> 6) & 1) * (long)pdVar19[6];
          auVar30._56_8_ = (uVar18 >> 7) * (long)pdVar19[7];
          auVar29 = vaddpd_avx512f(auVar29,auVar30);
          pdVar19 = local_108.m_data + lVar25 * 8 + uVar22;
          bVar6 = (bool)((byte)(uVar18 >> 1) & 1);
          bVar7 = (bool)((byte)(uVar18 >> 2) & 1);
          bVar8 = (bool)((byte)(uVar18 >> 3) & 1);
          bVar9 = (bool)((byte)(uVar18 >> 4) & 1);
          bVar10 = (bool)((byte)(uVar18 >> 5) & 1);
          bVar11 = (bool)((byte)(uVar18 >> 6) & 1);
          *pdVar19 = (double)((ulong)(bVar5 & 1) * auVar29._0_8_ |
                             (ulong)!(bool)(bVar5 & 1) * (long)*pdVar19);
          pdVar19[1] = (double)((ulong)bVar6 * auVar29._8_8_ | (ulong)!bVar6 * (long)pdVar19[1]);
          pdVar19[2] = (double)((ulong)bVar7 * auVar29._16_8_ | (ulong)!bVar7 * (long)pdVar19[2]);
          pdVar19[3] = (double)((ulong)bVar8 * auVar29._24_8_ | (ulong)!bVar8 * (long)pdVar19[3]);
          pdVar19[4] = (double)((ulong)bVar9 * auVar29._32_8_ | (ulong)!bVar9 * (long)pdVar19[4]);
          pdVar19[5] = (double)((ulong)bVar10 * auVar29._40_8_ | (ulong)!bVar10 * (long)pdVar19[5]);
          pdVar19[6] = (double)((ulong)bVar11 * auVar29._48_8_ | (ulong)!bVar11 * (long)pdVar19[6]);
          pdVar19[7] = (double)((uVar18 >> 7) * auVar29._56_8_ |
                               (ulong)!SUB81(uVar18 >> 7,0) * (long)pdVar19[7]);
          uVar22 = uVar22 + 8;
        } while (((long)uVar23 % 8 + 7U & 0xfffffffffffffff8) != uVar22);
      }
      sVar21 = sVar21 + 1;
    } while (sVar21 != local_f0);
  }
  math::arun((rotation_t *)local_98,(MatrixXd *)&local_108);
  auVar17._8_8_ = local_98._8_8_;
  auVar17._0_8_ = local_98._0_8_;
  lVar25 = 0x10;
  auVar12._8_8_ = local_b8._0_8_;
  auVar12._0_8_ = local_b8._0_8_;
  auVar26 = vmulpd_avx512vl(auVar17,auVar12);
  auVar13._8_8_ = local_b8._8_8_;
  auVar13._0_8_ = local_b8._8_8_;
  auVar26 = vfmadd132pd_avx512vl(stack0xffffffffffffff80,auVar26,auVar13);
  auVar32._8_8_ = local_a8[0];
  auVar32._0_8_ = local_a8[0];
  auVar26 = vfmadd231pd_fma(auVar26,auVar32,local_68);
  do {
    uVar14 = *(undefined8 *)((long)local_a8 + lVar25 + 8);
    uVar4 = *(undefined8 *)(local_98 + lVar25);
    puVar2 = (undefined8 *)
             ((long)(__return_storage_ptr__->
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).m_storage.m_data.
                    array + lVar25 + -0x10);
    *puVar2 = *(undefined8 *)((long)local_a8 + lVar25);
    puVar2[1] = uVar14;
    *(undefined8 *)
     ((long)(__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
            m_storage.m_data.array + lVar25) = uVar4;
    lVar25 = lVar25 + 0x18;
  } while (lVar25 != 0x58);
  auVar26 = vsubpd_avx(local_e8,auVar26);
  *(undefined1 (*) [16])
   ((__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).m_storage
    .m_data.array + 9) = auVar26;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).m_storage.
  m_data.array[0xb] =
       local_110 -
       ((double)local_98._16_8_ * (double)local_b8._0_8_ +
       local_70 * (double)local_b8._8_8_ + local_a8[0] * local_58);
  if (local_108.m_data != (double *)0x0) {
    free((void *)local_108.m_data[-1]);
  }
  return __return_storage_ptr__;
}

Assistant:

transformation_t threept_arun(
    const PointCloudAdapterBase & adapter,
    const Indices & indices )
{
  size_t numberCorrespondences = indices.size();
  assert(numberCorrespondences > 2);

  //derive the centroid of the two point-clouds
  point_t pointsCenter1 = Eigen::Vector3d::Zero();
  point_t pointsCenter2 = Eigen::Vector3d::Zero();

  for( size_t i = 0; i < numberCorrespondences; i++ )
  {
    pointsCenter1 += adapter.getPoint1(indices[i]);
    pointsCenter2 += adapter.getPoint2(indices[i]);
  }

  pointsCenter1 = pointsCenter1 / numberCorrespondences;
  pointsCenter2 = pointsCenter2 / numberCorrespondences;

  //compute the matrix H = sum(f'*f^{T})
  Eigen::MatrixXd Hcross(3,3);
  Hcross = Eigen::Matrix3d::Zero();

  for( size_t i = 0; i < numberCorrespondences; i++ )
  {
    Eigen::Vector3d f = adapter.getPoint1(indices[i]) - pointsCenter1;
    Eigen::Vector3d fprime = adapter.getPoint2(indices[i]) - pointsCenter2;
    Hcross += fprime * f.transpose();
  }

  //decompose this matrix (SVD) to obtain rotation
  rotation_t rotation = math::arun(Hcross);
  translation_t translation = pointsCenter1 - rotation*pointsCenter2;
  transformation_t solution;
  solution.block<3,3>(0,0) = rotation;
  solution.col(3) = translation;

  return solution;
}